

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O0

void __thiscall
JPolComponent_VectorImplementation::ClearIndividualPolicies
          (JPolComponent_VectorImplementation *this)

{
  bool bVar1;
  reference ppPVar2;
  __normal_iterator<PolicyPureVector_**,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
  *in_RDI;
  iterator last;
  iterator it;
  vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *in_stack_ffffffffffffffc8;
  PolicyPureVector *in_stack_ffffffffffffffd0;
  __normal_iterator<PolicyPureVector_**,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
  local_10 [2];
  
  local_10[0]._M_current =
       (PolicyPureVector **)
       std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::end
            (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<PolicyPureVector_**,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<PolicyPureVector_**,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<PolicyPureVector_**,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
              ::operator*(local_10);
    in_stack_ffffffffffffffd0 = *ppPVar2;
    if (in_stack_ffffffffffffffd0 != (PolicyPureVector *)0x0) {
      (*(in_stack_ffffffffffffffd0->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy.
        _vptr_Policy[1])();
    }
    __gnu_cxx::
    __normal_iterator<PolicyPureVector_**,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
    ::operator++(in_RDI,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  }
  std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::clear
            ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)0x98793d);
  return;
}

Assistant:

void JPolComponent_VectorImplementation::ClearIndividualPolicies()
{
    //NOTE: this means that when adding a ind. policy p to the joint policy (or 
    //replacing one) we should make a copy of p and insert the ref to this copy.
    //Otherwise deleting the joint policy deletes the individual policies, 
    //whose other references become dangling.
    vector<PolicyPureVector*>::iterator it = 
        _m_indivPols_PolicyPureVector.begin();
    vector<PolicyPureVector*>::iterator last = 
        _m_indivPols_PolicyPureVector.end();

    while(it != last)
    {
        delete (*it);
        it++;
    }
    _m_indivPols_PolicyPureVector.clear();    

}